

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O0

void __thiscall
libtorrent::session::start(session *this,session_flags_t flags,settings_pack *sp,io_service *ios)

{
  bool bVar1;
  bitfield_flag local_151;
  vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
  local_150;
  session_params local_138;
  io_service *local_28;
  io_service *ios_local;
  settings_pack *sp_local;
  session *this_local;
  session_flags_t flags_local;
  
  local_28 = ios;
  ios_local = (io_service *)sp;
  sp_local = (settings_pack *)this;
  this_local._7_1_ = flags.m_val;
  local_151 = (bitfield_flag)
              libtorrent::flags::operator&
                        ((bitfield_flag<unsigned_char,_libtorrent::session_flags_tag,_void>)
                         flags.m_val,
                         (bitfield_flag<unsigned_char,_libtorrent::session_flags_tag,_void>)0x1);
  bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_151);
  anon_unknown_90::default_plugins(&local_150,!bVar1);
  session_params::session_params(&local_138,sp,&local_150);
  start(this,&local_138,local_28);
  session_params::~session_params(&local_138);
  std::
  vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
  ::~vector(&local_150);
  return;
}

Assistant:

void session::start(session_flags_t const flags, settings_pack&& sp, io_service* ios)
	{
		start({std::move(sp),
			default_plugins(!(flags & add_default_plugins))}, ios);
	}